

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float128 float128_sub_ppc64(float128 a,float128 b,float_status *status)

{
  flag zSign;
  flag fVar1;
  flag bSign;
  flag aSign;
  float_status *status_local;
  float128 b_local;
  float128 a_local;
  
  zSign = extractFloat128Sign(a);
  fVar1 = extractFloat128Sign(b);
  if (zSign == fVar1) {
    join_0x00000010_0x00000000_ = subFloat128Sigs(a,b,zSign,status);
  }
  else {
    join_0x00000010_0x00000000_ = addFloat128Sigs(a,b,zSign,status);
  }
  return stack0xffffffffffffffe8;
}

Assistant:

float128 float128_sub(float128 a, float128 b, float_status *status)
{
    flag aSign, bSign;

    aSign = extractFloat128Sign( a );
    bSign = extractFloat128Sign( b );
    if ( aSign == bSign ) {
        return subFloat128Sigs(a, b, aSign, status);
    }
    else {
        return addFloat128Sigs(a, b, aSign, status);
    }

}